

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O3

ParamGenerator<std::tuple<void_(*)(unsigned_short_*,_int,_const_unsigned_char_*,_int,_int,_int),_void_(*)(unsigned_short_*,_int,_const_unsigned_char_*,_int,_int,_int)>_>
 __thiscall testing::internal::ValueArray::operator_cast_to_ParamGenerator(ValueArray *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  undefined8 *in_RSI;
  ParamGenerator<std::tuple<void_(*)(unsigned_short_*,_int,_const_unsigned_char_*,_int,_int,_int),_void_(*)(unsigned_short_*,_int,_const_unsigned_char_*,_int,_int,_int)>_>
  PVar2;
  initializer_list<std::tuple<void_(*)(unsigned_short_*,_int,_const_unsigned_char_*,_int,_int,_int),_void_(*)(unsigned_short_*,_int,_const_unsigned_char_*,_int,_int,_int)>_>
  __l;
  allocator_type local_41;
  vector<std::tuple<void_(*)(unsigned_short_*,_int,_const_unsigned_char_*,_int,_int,_int),_void_(*)(unsigned_short_*,_int,_const_unsigned_char_*,_int,_int,_int)>,_std::allocator<std::tuple<void_(*)(unsigned_short_*,_int,_const_unsigned_char_*,_int,_int,_int),_void_(*)(unsigned_short_*,_int,_const_unsigned_char_*,_int,_int,_int)>_>_>
  local_40;
  tuple<void_(*)(unsigned_short_*,_int,_const_unsigned_char_*,_int,_int,_int),_void_(*)(unsigned_short_*,_int,_const_unsigned_char_*,_int,_int,_int)>
  local_28;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  
  local_28.
  super__Tuple_impl<0UL,_void_(*)(unsigned_short_*,_int,_const_unsigned_char_*,_int,_int,_int),_void_(*)(unsigned_short_*,_int,_const_unsigned_char_*,_int,_int,_int)>
  .super__Tuple_impl<1UL,_void_(*)(unsigned_short_*,_int,_const_unsigned_char_*,_int,_int,_int)>.
  super__Head_base<1UL,_void_(*)(unsigned_short_*,_int,_const_unsigned_char_*,_int,_int,_int),_false>
  ._M_head_impl =
       (_Head_base<1UL,_void_(*)(unsigned_short_*,_int,_const_unsigned_char_*,_int,_int,_int),_false>
        )*in_RSI;
  local_28.
  super__Tuple_impl<0UL,_void_(*)(unsigned_short_*,_int,_const_unsigned_char_*,_int,_int,_int),_void_(*)(unsigned_short_*,_int,_const_unsigned_char_*,_int,_int,_int)>
  .
  super__Head_base<0UL,_void_(*)(unsigned_short_*,_int,_const_unsigned_char_*,_int,_int,_int),_false>
  ._M_head_impl = (_func_void_unsigned_short_ptr_int_uchar_ptr_int_int_int *)in_RSI[1];
  __l._M_len = 1;
  __l._M_array = &local_28;
  std::
  vector<std::tuple<void_(*)(unsigned_short_*,_int,_const_unsigned_char_*,_int,_int,_int),_void_(*)(unsigned_short_*,_int,_const_unsigned_char_*,_int,_int,_int)>,_std::allocator<std::tuple<void_(*)(unsigned_short_*,_int,_const_unsigned_char_*,_int,_int,_int),_void_(*)(unsigned_short_*,_int,_const_unsigned_char_*,_int,_int,_int)>_>_>
  ::vector(&local_40,__l,&local_41);
  PVar2 = ValuesIn<__gnu_cxx::__normal_iterator<std::tuple<void(*)(unsigned_short*,int,unsigned_char_const*,int,int,int),void(*)(unsigned_short*,int,unsigned_char_const*,int,int,int)>const*,std::vector<std::tuple<void(*)(unsigned_short*,int,unsigned_char_const*,int,int,int),void(*)(unsigned_short*,int,unsigned_char_const*,int,int,int)>,std::allocator<std::tuple<void(*)(unsigned_short*,int,unsigned_char_const*,int,int,int),void(*)(unsigned_short*,int,unsigned_char_const*,int,int,int)>>>>>
                    ((testing *)this,
                     (__normal_iterator<const_std::tuple<void_(*)(unsigned_short_*,_int,_const_unsigned_char_*,_int,_int,_int),_void_(*)(unsigned_short_*,_int,_const_unsigned_char_*,_int,_int,_int)>_*,_std::vector<std::tuple<void_(*)(unsigned_short_*,_int,_const_unsigned_char_*,_int,_int,_int),_void_(*)(unsigned_short_*,_int,_const_unsigned_char_*,_int,_int,_int)>,_std::allocator<std::tuple<void_(*)(unsigned_short_*,_int,_const_unsigned_char_*,_int,_int,_int),_void_(*)(unsigned_short_*,_int,_const_unsigned_char_*,_int,_int,_int)>_>_>_>
                      )local_40.
                       super__Vector_base<std::tuple<void_(*)(unsigned_short_*,_int,_const_unsigned_char_*,_int,_int,_int),_void_(*)(unsigned_short_*,_int,_const_unsigned_char_*,_int,_int,_int)>,_std::allocator<std::tuple<void_(*)(unsigned_short_*,_int,_const_unsigned_char_*,_int,_int,_int),_void_(*)(unsigned_short_*,_int,_const_unsigned_char_*,_int,_int,_int)>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,
                     (__normal_iterator<const_std::tuple<void_(*)(unsigned_short_*,_int,_const_unsigned_char_*,_int,_int,_int),_void_(*)(unsigned_short_*,_int,_const_unsigned_char_*,_int,_int,_int)>_*,_std::vector<std::tuple<void_(*)(unsigned_short_*,_int,_const_unsigned_char_*,_int,_int,_int),_void_(*)(unsigned_short_*,_int,_const_unsigned_char_*,_int,_int,_int)>,_std::allocator<std::tuple<void_(*)(unsigned_short_*,_int,_const_unsigned_char_*,_int,_int,_int),_void_(*)(unsigned_short_*,_int,_const_unsigned_char_*,_int,_int,_int)>_>_>_>
                      )local_40.
                       super__Vector_base<std::tuple<void_(*)(unsigned_short_*,_int,_const_unsigned_char_*,_int,_int,_int),_void_(*)(unsigned_short_*,_int,_const_unsigned_char_*,_int,_int,_int)>,_std::allocator<std::tuple<void_(*)(unsigned_short_*,_int,_const_unsigned_char_*,_int,_int,_int),_void_(*)(unsigned_short_*,_int,_const_unsigned_char_*,_int,_int,_int)>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  _Var1._M_pi = PVar2.impl_.
                super___shared_ptr<const_testing::internal::ParamGeneratorInterface<std::tuple<void_(*)(unsigned_short_*,_int,_const_unsigned_char_*,_int,_int,_int),_void_(*)(unsigned_short_*,_int,_const_unsigned_char_*,_int,_int,_int)>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi;
  if (local_40.
      super__Vector_base<std::tuple<void_(*)(unsigned_short_*,_int,_const_unsigned_char_*,_int,_int,_int),_void_(*)(unsigned_short_*,_int,_const_unsigned_char_*,_int,_int,_int)>,_std::allocator<std::tuple<void_(*)(unsigned_short_*,_int,_const_unsigned_char_*,_int,_int,_int),_void_(*)(unsigned_short_*,_int,_const_unsigned_char_*,_int,_int,_int)>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (tuple<void_(*)(unsigned_short_*,_int,_const_unsigned_char_*,_int,_int,_int),_void_(*)(unsigned_short_*,_int,_const_unsigned_char_*,_int,_int,_int)>
       *)0x0) {
    operator_delete(local_40.
                    super__Vector_base<std::tuple<void_(*)(unsigned_short_*,_int,_const_unsigned_char_*,_int,_int,_int),_void_(*)(unsigned_short_*,_int,_const_unsigned_char_*,_int,_int,_int)>,_std::allocator<std::tuple<void_(*)(unsigned_short_*,_int,_const_unsigned_char_*,_int,_int,_int),_void_(*)(unsigned_short_*,_int,_const_unsigned_char_*,_int,_int,_int)>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
    _Var1._M_pi = extraout_RDX;
  }
  PVar2.impl_.
  super___shared_ptr<const_testing::internal::ParamGeneratorInterface<std::tuple<void_(*)(unsigned_short_*,_int,_const_unsigned_char_*,_int,_int,_int),_void_(*)(unsigned_short_*,_int,_const_unsigned_char_*,_int,_int,_int)>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = _Var1._M_pi;
  PVar2.impl_.
  super___shared_ptr<const_testing::internal::ParamGeneratorInterface<std::tuple<void_(*)(unsigned_short_*,_int,_const_unsigned_char_*,_int,_int,_int),_void_(*)(unsigned_short_*,_int,_const_unsigned_char_*,_int,_int,_int)>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)this;
  return (ParamGenerator<std::tuple<void_(*)(unsigned_short_*,_int,_const_unsigned_char_*,_int,_int,_int),_void_(*)(unsigned_short_*,_int,_const_unsigned_char_*,_int,_int,_int)>_>
          )PVar2.impl_.
           super___shared_ptr<const_testing::internal::ParamGeneratorInterface<std::tuple<void_(*)(unsigned_short_*,_int,_const_unsigned_char_*,_int,_int,_int),_void_(*)(unsigned_short_*,_int,_const_unsigned_char_*,_int,_int,_int)>_>,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

operator ParamGenerator<T>() const {  // NOLINT
    return ValuesIn(MakeVector<T>(MakeIndexSequence<sizeof...(Ts)>()));
  }